

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,BlockStatementSyntax *syntax)

{
  NamedBlockClauseSyntax *pNVar1;
  SourceLocation SVar2;
  StatementBlockSymbol *pSVar3;
  BlockStatementSyntax *in_RSI;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar4;
  StatementBlockSymbol *result;
  Token token;
  SourceLocation loc;
  string_view name;
  SyntaxList<slang::syntax::SyntaxNode> *in_stack_000000e8;
  Scope *in_stack_000000f0;
  SourceLocation *in_stack_ffffffffffffff20;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
  *in_stack_ffffffffffffff28;
  Token *in_stack_ffffffffffffff30;
  pointer local_b8;
  __extent_storage<18446744073709551615UL> local_b0;
  StatementSyntax *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff90;
  StatementBlockKind blockKind;
  StatementSyntax *in_stack_ffffffffffffff98;
  Scope *in_stack_ffffffffffffffa0;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  Token local_38;
  SourceLocation local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  BlockStatementSyntax *local_10;
  
  blockKind = (StatementBlockKind)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20);
  SourceLocation::SourceLocation(&local_28);
  if (local_10->blockName == (NamedBlockClauseSyntax *)0x0) {
    SVar2 = parsing::Token::location(&local_10->begin);
    blockKind = SVar2._4_4_;
    getLabel(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    std::tie<std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
              (&in_stack_ffffffffffffff28->first,in_stack_ffffffffffffff20);
    std::tuple<std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>::
    operator=((tuple<std::basic_string_view<char,_std::char_traits<char>_>_&,_slang::SourceLocation_&>
               *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  else {
    pNVar1 = local_10->blockName;
    local_38.kind = (pNVar1->name).kind;
    local_38._2_1_ = (pNVar1->name).field_0x2;
    local_38.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_38.rawLen = (pNVar1->name).rawLen;
    local_38.info = (pNVar1->name).info;
    in_stack_ffffffffffffffb8 = parsing::Token::valueText(in_stack_ffffffffffffff30);
    local_20._M_len = in_stack_ffffffffffffffb8._M_len;
    local_20._M_str = in_stack_ffffffffffffffb8._M_str;
    in_stack_ffffffffffffffb0 = parsing::Token::location(&local_38);
    local_28 = in_stack_ffffffffffffffb0;
  }
  SemanticFacts::getStatementBlockKind(local_10);
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)0xf7206e);
  pSVar3 = createBlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffffb8
                       ,in_stack_ffffffffffffffb0,blockKind,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffa8);
  sVar4 = Statement::createAndAddBlockItems(in_stack_000000f0,in_stack_000000e8);
  local_b8 = sVar4._M_ptr;
  (pSVar3->blocks)._M_ptr = local_b8;
  local_b0 = sVar4._M_extent._M_extent_value;
  (pSVar3->blocks)._M_extent._M_extent_value = local_b0._M_extent_value;
  return pSVar3;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const BlockStatementSyntax& syntax) {
    std::string_view name;
    SourceLocation loc;
    if (syntax.blockName) {
        auto token = syntax.blockName->name;
        name = token.valueText();
        loc = token.location();
    }
    else {
        std::tie(name, loc) = getLabel(syntax, syntax.begin.location());
    }

    auto result = createBlock(scope, syntax, name, loc,
                              SemanticFacts::getStatementBlockKind(syntax));

    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);
    return *result;
}